

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

bool __thiscall
google::anon_unknown_10::LogFileObject::CreateLogfile(LogFileObject *this,string *time_pid_string)

{
  size_type *psVar1;
  pointer pcVar2;
  size_type sVar3;
  undefined8 __name;
  int __fd;
  int iVar4;
  FILE *pFVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined8 __from;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string string_filename;
  string linkname;
  string linkpath;
  
  __str.field_2._8_8_ = &string_filename._M_string_length;
  pcVar2 = (this->base_filename_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&__str.field_2 + 8),pcVar2,
             pcVar2 + (this->base_filename_)._M_string_length);
  if (fLB::FLAGS_timestamp_in_logfile_name == 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&__str.field_2 + 8),(time_pid_string->_M_dataplus)._M_p,
               time_pid_string->_M_string_length);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&__str.field_2 + 8),(this->filename_extension_)._M_dataplus._M_p,
             (this->filename_extension_)._M_string_length);
  __name = __str.field_2._8_8_;
  __fd = open((char *)__str.field_2._8_8_,(uint)fLB::FLAGS_timestamp_in_logfile_name << 7 | 0x41,
              (ulong)fLI::FLAGS_logfile_mode);
  if (__fd != -1) {
    fcntl(__fd,2,1);
    CreateLogfile::w_lock.l_type = 1;
    CreateLogfile::w_lock.l_whence = 0;
    CreateLogfile::w_lock.l_start = 0;
    CreateLogfile::w_lock.l_len = 0;
    iVar4 = fcntl(__fd,6,&CreateLogfile::w_lock);
    if (iVar4 == -1) {
      close(__fd);
    }
    else {
      pFVar5 = fdopen(__fd,"a");
      this->file_ = (FILE *)pFVar5;
      if (pFVar5 != (FILE *)0x0) {
        sVar3 = (this->symlink_basename_)._M_string_length;
        bVar9 = true;
        if (sVar3 != 0) {
          pcVar6 = strrchr((char *)__name,0x2f);
          linkname.field_2._8_8_ = &linkpath._M_string_length;
          pcVar2 = (this->symlink_basename_)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)((long)&linkname.field_2 + 8),pcVar2,pcVar2 + sVar3);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&linkname.field_2 + 8),(size_type)linkpath._M_dataplus._M_p,0,1,'.')
          ;
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&linkname.field_2 + 8),
                          *(char **)(LogSeverityNames + (long)this->severity_ * 8));
          paVar8 = &pbVar7->field_2;
          psVar1 = &linkpath._M_string_length;
          string_filename.field_2._8_8_ = (pbVar7->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)string_filename.field_2._8_8_ == paVar8) {
            linkname._M_string_length = paVar8->_M_allocated_capacity;
            linkname.field_2._M_allocated_capacity = *(size_type *)((long)&pbVar7->field_2 + 8);
            string_filename.field_2._8_8_ = &linkname._M_string_length;
          }
          else {
            linkname._M_string_length = paVar8->_M_allocated_capacity;
          }
          linkname._M_dataplus._M_p = (pointer)pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          if ((size_type *)linkname.field_2._8_8_ != psVar1) {
            operator_delete((void *)linkname.field_2._8_8_,
                            CONCAT71(linkpath._M_string_length._1_7_,
                                     (undefined1)linkpath._M_string_length) + 1);
          }
          linkpath._M_dataplus._M_p = (pointer)0x0;
          linkpath._M_string_length._0_1_ = 0;
          linkname.field_2._8_8_ = psVar1;
          if (pcVar6 != (char *)0x0) {
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,__name,pcVar6 + 1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&linkname.field_2 + 8),&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&linkname.field_2 + 8),(char *)string_filename.field_2._8_8_,
                     (size_type)linkname._M_dataplus._M_p);
          unlink((char *)linkname.field_2._8_8_);
          __from = pcVar6 + 1;
          if (pcVar6 == (char *)0x0) {
            __from = __name;
          }
          symlink((char *)__from,(char *)linkname.field_2._8_8_);
          if (fLS::FLAGS_log_link_abi_cxx11_[1] != 0) {
            local_b0 = (undefined1  [8])&__str._M_string_length;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b0,*fLS::FLAGS_log_link_abi_cxx11_,
                       fLS::FLAGS_log_link_abi_cxx11_[1] + *fLS::FLAGS_log_link_abi_cxx11_);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,"/");
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b0,(char *)string_filename.field_2._8_8_,
                                 (size_type)linkname._M_dataplus._M_p);
            paVar8 = &pbVar7->field_2;
            local_d0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p == paVar8) {
              local_d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_d0._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&linkname.field_2 + 8),&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if (local_b0 != (undefined1  [8])&__str._M_string_length) {
              operator_delete((void *)local_b0,__str._M_string_length + 1);
            }
            unlink((char *)linkname.field_2._8_8_);
            symlink((char *)__name,(char *)linkname.field_2._8_8_);
          }
          if ((size_type *)linkname.field_2._8_8_ != &linkpath._M_string_length) {
            operator_delete((void *)linkname.field_2._8_8_,
                            CONCAT71(linkpath._M_string_length._1_7_,
                                     (undefined1)linkpath._M_string_length) + 1);
          }
          if ((size_type *)string_filename.field_2._8_8_ != &linkname._M_string_length) {
            operator_delete((void *)string_filename.field_2._8_8_,linkname._M_string_length + 1);
          }
        }
        goto LAB_0011940b;
      }
      close(__fd);
      if (fLB::FLAGS_timestamp_in_logfile_name == 1) {
        unlink((char *)__name);
      }
    }
  }
  bVar9 = false;
LAB_0011940b:
  if ((size_type *)__str.field_2._8_8_ != &string_filename._M_string_length) {
    operator_delete((void *)__str.field_2._8_8_,string_filename._M_string_length + 1);
  }
  return bVar9;
}

Assistant:

bool LogFileObject::CreateLogfile(const string& time_pid_string) {
  string string_filename = base_filename_;
  if (FLAGS_timestamp_in_logfile_name) {
    string_filename += time_pid_string;
  }
  string_filename += filename_extension_;
  const char* filename = string_filename.c_str();
  //only write to files, create if non-existant.
  int flags = O_WRONLY | O_CREAT;
  if (FLAGS_timestamp_in_logfile_name) {
    //demand that the file is unique for our timestamp (fail if it exists).
    flags = flags | O_EXCL;
  }
  int fd = open(filename, flags, FLAGS_logfile_mode);
  if (fd == -1) return false;
#ifdef HAVE_FCNTL
  // Mark the file close-on-exec. We don't really care if this fails
  fcntl(fd, F_SETFD, FD_CLOEXEC);

  // Mark the file as exclusive write access to avoid two clients logging to the
  // same file. This applies particularly when !FLAGS_timestamp_in_logfile_name
  // (otherwise open would fail because the O_EXCL flag on similar filename).
  // locks are released on unlock or close() automatically, only after log is
  // released.
  // This will work after a fork as it is not inherited (not stored in the fd).
  // Lock will not be lost because the file is opened with exclusive lock (write)
  // and we will never read from it inside the process.
  // TODO windows implementation of this (as flock is not available on mingw).
  static struct flock w_lock;

  w_lock.l_type = F_WRLCK;
  w_lock.l_start = 0;
  w_lock.l_whence = SEEK_SET;
  w_lock.l_len = 0;

  int wlock_ret = fcntl(fd, F_SETLK, &w_lock);
  if (wlock_ret == -1) {
      close(fd); //as we are failing already, do not check errors here
      return false;
  }
#endif

  //fdopen in append mode so if the file exists it will fseek to the end
  file_ = fdopen(fd, "a");  // Make a FILE*.
  if (file_ == NULL) {  // Man, we're screwed!
    close(fd);
    if (FLAGS_timestamp_in_logfile_name) {
      unlink(filename);  // Erase the half-baked evidence: an unusable log file, only if we just created it.
    }
    return false;
  }
#ifdef GLOG_OS_WINDOWS
  // https://github.com/golang/go/issues/27638 - make sure we seek to the end to append
  // empirically replicated with wine over mingw build
  if (!FLAGS_timestamp_in_logfile_name) {
    if (fseek(file_, 0, SEEK_END) != 0) {
      return false;
    }
  }
#endif
  // We try to create a symlink called <program_name>.<severity>,
  // which is easier to use.  (Every time we create a new logfile,
  // we destroy the old symlink and create a new one, so it always
  // points to the latest logfile.)  If it fails, we're sad but it's
  // no error.
  if (!symlink_basename_.empty()) {
    // take directory from filename
    const char* slash = strrchr(filename, PATH_SEPARATOR);
    const string linkname =
      symlink_basename_ + '.' + LogSeverityNames[severity_];
    string linkpath;
    if ( slash ) linkpath = string(filename, static_cast<size_t>(slash-filename+1));  // get dirname
    linkpath += linkname;
    unlink(linkpath.c_str());                    // delete old one if it exists

#if defined(GLOG_OS_WINDOWS)
    // TODO(hamaji): Create lnk file on Windows?
#elif defined(HAVE_UNISTD_H)
    // We must have unistd.h.
    // Make the symlink be relative (in the same dir) so that if the
    // entire log directory gets relocated the link is still valid.
    const char *linkdest = slash ? (slash + 1) : filename;
    if (symlink(linkdest, linkpath.c_str()) != 0) {
      // silently ignore failures
    }

    // Make an additional link to the log file in a place specified by
    // FLAGS_log_link, if indicated
    if (!FLAGS_log_link.empty()) {
      linkpath = FLAGS_log_link + "/" + linkname;
      unlink(linkpath.c_str());                  // delete old one if it exists
      if (symlink(filename, linkpath.c_str()) != 0) {
        // silently ignore failures
      }
    }
#endif
  }

  return true;  // Everything worked
}